

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

uint32_t __thiscall fasttext::Dictionary::hash(Dictionary *this,string *str)

{
  uint uVar1;
  size_type sVar2;
  
  uVar1 = 0x811c9dc5;
  for (sVar2 = 0; str->_M_string_length != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = (uVar1 ^ (int)(str->_M_dataplus)._M_p[sVar2]) * 0x1000193;
  }
  return uVar1;
}

Assistant:

uint32_t Dictionary::hash(const std::string& str) const {
  uint32_t h = 2166136261;
  for (size_t i = 0; i < str.size(); i++) {
    h = h ^ uint32_t(str[i]);
    h = h * 16777619;
  }
  return h;
}